

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void Ppmd7_EncodeSymbol(CPpmd7 *p,CPpmd7z_RangeEnc *rc,int symbol)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  Byte *pBVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  CPpmd7_Context *pCVar10;
  int iVar11;
  UInt16 *pUVar12;
  CPpmd_State *pCVar13;
  UInt32 start;
  byte *pbVar14;
  UInt32 UVar15;
  CPpmd_State *pCVar16;
  UInt32 escFreq;
  size_t charMask [32];
  uint local_14c;
  CPpmd7_Context *local_148;
  ulong local_140;
  byte local_138 [264];
  
  pCVar10 = p->MinContext;
  uVar5 = pCVar10->NumStats;
  if (uVar5 == 1) {
    bVar1 = *(Byte *)((long)&pCVar10->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar10->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    bVar4 = (byte)pCVar10->SummFreq;
    pUVar12 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 + (uint)p->HB2Flag[bVar4] * 2);
    uVar9 = (rc->Range >> 0xe) * (uint)*pUVar12;
    if ((uint)bVar4 == symbol) {
      rc->Range = uVar9;
      while (uVar9 < 0x1000000) {
        rc->Range = uVar9 << 8;
        RangeEnc_ShiftLow(rc);
        uVar9 = rc->Range;
      }
      *pUVar12 = (*pUVar12 - (short)(*pUVar12 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&pCVar10->SummFreq;
      bVar1 = *(Byte *)((long)&pCVar10->SummFreq + 1);
      *(byte *)((long)&pCVar10->SummFreq + 1) = bVar1 - ((char)~bVar1 >> 7);
      p->PrevSuccess = 1;
      p->RunLength = p->RunLength + 1;
      NextContext(p);
    }
    else {
      rc->Low = rc->Low + (ulong)uVar9;
      uVar9 = rc->Range - uVar9;
      rc->Range = uVar9;
      while (uVar9 < 0x1000000) {
        rc->Range = uVar9 << 8;
        RangeEnc_ShiftLow(rc);
        uVar9 = rc->Range;
      }
      uVar9 = (uint)*pUVar12 - (*pUVar12 + 0x20 >> 7);
      *pUVar12 = (ushort)uVar9;
      p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                         [(uVar9 & 0xffff) >> 10];
      memset(local_138,0xff,0x100);
      local_138[(byte)pCVar10->SummFreq] = 0;
      p->PrevSuccess = 0;
    }
    if ((uint)bVar4 == symbol) {
      return;
    }
  }
  else {
    pBVar6 = p->Base;
    uVar8 = (ulong)pCVar10->Stats;
    if ((uint)pBVar6[uVar8] == symbol) {
      RangeEnc_Encode(rc,0,(uint)((CPpmd_State *)(pBVar6 + uVar8))->Freq,(uint)pCVar10->SummFreq);
      p->FoundState = (CPpmd_State *)(pBVar6 + uVar8);
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    pbVar14 = pBVar6 + (uVar8 - 6);
    UVar15 = (UInt32)pBVar6[uVar8 + 1];
    iVar11 = uVar5 - 1;
    iVar7 = iVar11;
    do {
      bVar1 = pbVar14[0xc];
      local_148 = pCVar10;
      if ((uint)bVar1 == symbol) {
        RangeEnc_Encode(rc,UVar15,(uint)pbVar14[0xd],(uint)pCVar10->SummFreq);
        p->FoundState = (CPpmd_State *)(pbVar14 + 0xc);
        Ppmd7_Update1(p);
        return;
      }
      UVar15 = UVar15 + pbVar14[0xd];
      pbVar14 = pbVar14 + 6;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    memset(local_138,0xff,0x100);
    local_138[bVar1] = 0;
    do {
      local_138[*pbVar14] = 0;
      pbVar14 = pbVar14 + -6;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    RangeEnc_Encode(rc,UVar15,local_148->SummFreq - UVar15,(uint)local_148->SummFreq);
  }
  do {
    pCVar10 = p->MinContext;
    uVar5 = pCVar10->NumStats;
    uVar9 = p->OrderFall;
    do {
      uVar8 = (ulong)pCVar10->Suffix;
      if (uVar8 == 0) {
        p->OrderFall = uVar9 + 1;
        return;
      }
      pCVar10 = (CPpmd7_Context *)(p->Base + uVar8);
      p->MinContext = pCVar10;
      uVar9 = uVar9 + 1;
    } while (*(ushort *)(p->Base + uVar8) == uVar5);
    p->OrderFall = uVar9;
    local_148 = (CPpmd7_Context *)Ppmd7_MakeEscFreq(p,(uint)uVar5,&local_14c);
    pCVar13 = (CPpmd_State *)(p->Base + p->MinContext->Stats);
    uVar9 = (uint)p->MinContext->NumStats;
    local_140 = (ulong)local_14c;
    UVar15 = 0;
    do {
      bVar1 = pCVar13->Symbol;
      pCVar16 = pCVar13;
      start = UVar15;
      if ((uint)bVar1 == symbol) {
        do {
          start = start + (local_138[pCVar16->Symbol] & pCVar16->Freq);
          pCVar16 = pCVar16 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        RangeEnc_Encode(rc,UVar15,(uint)pCVar13->Freq,(int)local_140 + start);
        bVar2 = (byte)local_148->SummFreq;
        if (bVar2 < 7) {
          pBVar6 = (Byte *)((long)&local_148->SummFreq + 1);
          *pBVar6 = *pBVar6 + 0xff;
          if (*pBVar6 == '\0') {
            local_148->NumStats = local_148->NumStats << 1;
            *(byte *)&local_148->SummFreq = bVar2 + 1;
            *(Byte *)((long)&local_148->SummFreq + 1) = (Byte)(3 << (bVar2 & 0x1f));
          }
        }
        p->FoundState = pCVar13;
        Ppmd7_Update2(p);
        uVar9 = 0xffffffff;
        pCVar13 = pCVar16;
      }
      else {
        start = UVar15 + (local_138[bVar1] & pCVar13->Freq);
        local_138[bVar1] = 0;
        pCVar13 = pCVar13 + 1;
        uVar9 = uVar9 - 1;
      }
      if ((uint)bVar1 == symbol) {
        return;
      }
      UVar15 = start;
    } while (uVar9 != 0);
    UVar15 = local_14c + start;
    RangeEnc_Encode(rc,start,local_14c,UVar15);
    local_148->NumStats = local_148->NumStats + (short)UVar15;
  } while( true );
}

Assistant:

static void Ppmd7_EncodeSymbol(CPpmd7 *p, CPpmd7z_RangeEnc *rc, int symbol)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    UInt32 sum;
    unsigned i;
    if (s->Symbol == symbol)
    {
      RangeEnc_Encode(rc, 0, s->Freq, p->MinContext->SummFreq);
      p->FoundState = s;
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    sum = s->Freq;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((++s)->Symbol == symbol)
      {
        RangeEnc_Encode(rc, sum, s->Freq, p->MinContext->SummFreq);
        p->FoundState = s;
        Ppmd7_Update1(p);
        return;
      }
      sum += s->Freq;
    }
    while (--i);
    
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
    RangeEnc_Encode(rc, sum, p->MinContext->SummFreq - sum, p->MinContext->SummFreq);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    CPpmd_State *s = Ppmd7Context_OneState(p->MinContext);
    if (s->Symbol == symbol)
    {
      RangeEnc_EncodeBit_0(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      p->FoundState = s;
      Ppmd7_UpdateBin(p);
      return;
    }
    else
    {
      RangeEnc_EncodeBit_1(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
      p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
      PPMD_SetAllBitsIn256Bytes(charMask);
      MASK(s->Symbol) = 0;
      p->PrevSuccess = 0;
    }
  }
  for (;;)
  {
    UInt32 escFreq;
    CPpmd_See *see;
    CPpmd_State *s;
    UInt32 sum;
    unsigned i, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return; /* EndMarker (symbol = -1) */
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &escFreq);
    s = Ppmd7_GetStats(p, p->MinContext);
    sum = 0;
    i = p->MinContext->NumStats;
    do
    {
      int cur = s->Symbol;
      if (cur == symbol)
      {
        UInt32 low = sum;
        CPpmd_State *s1 = s;
        do
        {
          sum += (s->Freq & (int)(MASK(s->Symbol)));
          s++;
        }
        while (--i);
        RangeEnc_Encode(rc, low, s1->Freq, sum + escFreq);
        Ppmd_See_Update(see);
        p->FoundState = s1;
        Ppmd7_Update2(p);
        return;
      }
      sum += (s->Freq & (int)(MASK(cur)));
      MASK(cur) = 0;
      s++;
    }
    while (--i);
    
    RangeEnc_Encode(rc, sum, escFreq, sum + escFreq);
    see->Summ = (UInt16)(see->Summ + sum + escFreq);
  }
}